

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void mon_break_armor(level *lev,monst *mon,boolean polyspot)

{
  permonst *ptr;
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  boolean bVar4;
  int iVar5;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  char local_148 [8];
  char buf [256];
  char *ppronoun;
  char *pronoun;
  boolean handless_or_tiny;
  boolean vis;
  permonst *mdat;
  obj *otmp;
  boolean polyspot_local;
  monst *mon_local;
  level *lev_local;
  
  ptr = mon->data;
  bVar3 = viz_array[mon->my][mon->mx] & 2;
  bVar1 = true;
  if ((ptr->mflags1 & 0x2000) == 0) {
    bVar1 = ptr->msize == '\0';
  }
  iVar5 = pronoun_gender(lev,mon);
  pcVar7 = genders[iVar5].him;
  iVar5 = pronoun_gender(lev,mon);
  buf._248_8_ = genders[iVar5].his;
  bVar4 = breakarm(ptr);
  if (bVar4 == '\0') {
    bVar4 = sliparm(ptr);
    if (bVar4 != '\0') {
      poVar6 = which_armor(mon,1);
      if (poVar6 != (obj *)0x0) {
        if (bVar3 == 0) {
          You_hear("a thud.");
        }
        else {
          pcVar8 = Monnam(mon);
          pcVar8 = s_suffix(pcVar8);
          pline("%s armor falls around %s!",pcVar8,pcVar7);
        }
        if (polyspot != '\0') {
          bypass_obj(poVar6);
        }
        m_lose_armor(mon,poVar6);
      }
      poVar6 = which_armor(mon,2);
      if (poVar6 != (obj *)0x0) {
        if (bVar3 != 0) {
          if ((mon->data->mlet == '\x16') || (mon->data == mons + 0x9f)) {
            pcVar7 = Monnam(mon);
            pcVar7 = s_suffix(pcVar7);
            pcVar8 = cloak_simple_name(poVar6);
            pline("%s %s falls, unsupported!",pcVar7,pcVar8);
          }
          else {
            pcVar7 = Monnam(mon);
            uVar2 = buf._248_8_;
            pcVar8 = cloak_simple_name(poVar6);
            pline("%s shrinks out of %s %s!",pcVar7,uVar2,pcVar8);
          }
        }
        if (polyspot != '\0') {
          bypass_obj(poVar6);
        }
        m_lose_armor(mon,poVar6);
      }
      poVar6 = which_armor(mon,0x40);
      if (poVar6 != (obj *)0x0) {
        if (bVar3 != 0) {
          bVar4 = sliparm(mon->data);
          if (bVar4 == '\0') {
            pcVar7 = Monnam(mon);
            pline("%s becomes much too small for %s shirt!",pcVar7,buf._248_8_);
          }
          else {
            pcVar7 = Monnam(mon);
            pline("%s seeps right through %s shirt!",pcVar7,buf._248_8_);
          }
        }
        if (polyspot != '\0') {
          bypass_obj(poVar6);
        }
        m_lose_armor(mon,poVar6);
      }
    }
  }
  else {
    poVar6 = which_armor(mon,1);
    if (poVar6 != (obj *)0x0) {
      if ((((poVar6->otyp < 0x5f) || (0x69 < poVar6->otyp)) || (ptr != mons + (poVar6->otyp + 0x34))
          ) && (((poVar6->otyp < 0x54 || (0x5e < poVar6->otyp)) ||
                (ptr != mons + (poVar6->otyp + 0x3f))))) {
        if (bVar3 == 0) {
          You_hear("a cracking sound.");
        }
        else {
          pcVar7 = Monnam(mon);
          pline("%s breaks out of %s armor!",pcVar7,buf._248_8_);
        }
      }
      m_useup(mon,poVar6);
    }
    poVar6 = which_armor(mon,2);
    if (poVar6 != (obj *)0x0) {
      if (poVar6->oartifact == '\0') {
        if (bVar3 == 0) {
          You_hear("a ripping sound.");
        }
        else {
          pcVar7 = Monnam(mon);
          pcVar7 = s_suffix(pcVar7);
          pcVar8 = cloak_simple_name(poVar6);
          pline("%s %s tears apart!",pcVar7,pcVar8);
        }
        m_useup(mon,poVar6);
      }
      else {
        if (bVar3 != 0) {
          pcVar7 = Monnam(mon);
          pcVar7 = s_suffix(pcVar7);
          pcVar8 = cloak_simple_name(poVar6);
          pline("%s %s falls off!",pcVar7,pcVar8);
        }
        if (polyspot != '\0') {
          bypass_obj(poVar6);
        }
        m_lose_armor(mon,poVar6);
      }
    }
    poVar6 = which_armor(mon,0x40);
    if (poVar6 != (obj *)0x0) {
      if (bVar3 == 0) {
        You_hear("a ripping sound.");
      }
      else {
        pcVar7 = Monnam(mon);
        pcVar7 = s_suffix(pcVar7);
        pline("%s shirt rips to shreds!",pcVar7);
      }
      m_useup(mon,poVar6);
    }
  }
  if (bVar1) {
    poVar6 = which_armor(mon,0x10);
    if (poVar6 != (obj *)0x0) {
      if (bVar3 != 0) {
        pcVar7 = Monnam(mon);
        pcVar8 = "";
        if (mon->mw != (obj *)0x0) {
          pcVar8 = " and weapon";
        }
        pline("%s drops %s gloves%s!",pcVar7,buf._248_8_,pcVar8);
      }
      if (polyspot != '\0') {
        bypass_obj(poVar6);
      }
      m_lose_armor(mon,poVar6);
    }
    poVar6 = which_armor(mon,8);
    if (poVar6 != (obj *)0x0) {
      if (bVar3 == 0) {
        You_hear("a clank.");
      }
      else {
        pcVar7 = Monnam(mon);
        pline("%s can no longer hold %s shield!",pcVar7,buf._248_8_);
      }
      if (polyspot != '\0') {
        bypass_obj(poVar6);
      }
      m_lose_armor(mon,poVar6);
    }
  }
  if (((bVar1) || (iVar5 = num_horns(ptr), 0 < iVar5)) &&
     ((poVar6 = which_armor(mon,4), poVar6 != (obj *)0x0 &&
      ((bVar1 || ((7 < (*(ushort *)&objects[poVar6->otyp].field_0x11 >> 4 & 0x1f) &&
                  (poVar6->otyp != 0x3d)))))))) {
    if (bVar3 == 0) {
      You_hear("a clank.");
    }
    else {
      pcVar7 = Monnam(mon);
      pcVar7 = s_suffix(pcVar7);
      pcVar8 = surface((int)mon->mx,(int)mon->my);
      pline("%s helmet falls to the %s!",pcVar7,pcVar8);
    }
    if (polyspot != '\0') {
      bypass_obj(poVar6);
    }
    m_lose_armor(mon,poVar6);
  }
  if ((((bVar1) || ((ptr->mflags1 & 0x80000) != 0)) || (ptr->mlet == '\x1d')) &&
     (poVar6 = which_armor(mon,0x20), poVar6 != (obj *)0x0)) {
    if (bVar3 != 0) {
      if ((mon->data->mlet == '\x16') || (mon->data == mons + 0x9f)) {
        pcVar7 = Monnam(mon);
        pcVar7 = s_suffix(pcVar7);
        pline("%s boots fall away!",pcVar7);
      }
      else {
        pcVar7 = Monnam(mon);
        pcVar7 = s_suffix(pcVar7);
        pcVar8 = "are pushed";
        if (ptr->msize == '\0') {
          pcVar8 = "slide";
        }
        pline("%s boots %s off %s feet!",pcVar7,pcVar8,buf._248_8_);
      }
    }
    if (polyspot != '\0') {
      bypass_obj(poVar6);
    }
    m_lose_armor(mon,poVar6);
  }
  bVar4 = can_saddle(mon);
  if (bVar4 == '\0') {
    poVar6 = which_armor(mon,0x100000);
    if (poVar6 != (obj *)0x0) {
      if (polyspot != '\0') {
        bypass_obj(poVar6);
      }
      m_lose_armor(mon,poVar6);
      if (bVar3 != 0) {
        pcVar7 = Monnam(mon);
        pcVar7 = s_suffix(pcVar7);
        pline("%s saddle falls off.",pcVar7);
      }
    }
    if (mon != u.usteed) {
      return;
    }
  }
  else {
    if (mon != u.usteed) {
      return;
    }
    bVar4 = can_ride(mon);
    if (bVar4 != '\0') {
      return;
    }
  }
  pcVar7 = mon_nam(mon);
  pline("You can no longer ride %s.",pcVar7);
  if ((((u.usteed)->data == mons + 0xc) || ((u.usteed)->data == mons + 0xb)) &&
     ((u.uprops[8].extrinsic == 0 &&
      (((youmonst.mintrinsics & 0x80) == 0 && (iVar5 = rnl(3), iVar5 != 0)))))) {
    pcVar7 = mon_nam(u.usteed);
    pline("You touch %s.",pcVar7);
    pcVar7 = mons_mname((u.usteed)->data);
    pcVar7 = an(pcVar7);
    sprintf(local_148,"falling off %s",pcVar7);
    delayed_petrify((char *)0x0,local_148);
  }
  dismount_steed(1);
  return;
}

Assistant:

void mon_break_armor(struct level *lev, struct monst *mon, boolean polyspot)
{
	struct obj *otmp;
	const struct permonst *mdat = mon->data;
	boolean vis = cansee(mon->mx, mon->my);
	boolean handless_or_tiny = (nohands(mdat) || verysmall(mdat));
	const char *pronoun = mhim(lev, mon),
		   *ppronoun = mhis(lev, mon);

	if (breakarm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if ((Is_dragon_scales(otmp->otyp) &&
			mdat == Dragon_scales_to_pm(otmp)) ||
		    (Is_dragon_mail(otmp->otyp) && mdat == Dragon_mail_to_pm(otmp)))
		    ;	/* no message here;
			   "the dragon merges with his scaly armor" is odd
			   and the monster's previous form is already gone */
		else if (vis)
		    pline("%s breaks out of %s armor!", Monnam(mon), ppronoun);
		else
		    You_hear("a cracking sound.");
		m_useup(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (otmp->oartifact) {
		    if (vis)
			pline("%s %s falls off!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    if (polyspot) bypass_obj(otmp);
		    m_lose_armor(mon, otmp);
		} else {
		    if (vis)
			pline("%s %s tears apart!", s_suffix(Monnam(mon)),
				cloak_simple_name(otmp));
		    else
			You_hear("a ripping sound.");
		    m_useup(mon, otmp);
		}
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis)
		    pline("%s shirt rips to shreds!", s_suffix(Monnam(mon)));
		else
		    You_hear("a ripping sound.");
		m_useup(mon, otmp);
	    }
	} else if (sliparm(mdat)) {
	    if ((otmp = which_armor(mon, W_ARM)) != 0) {
		if (vis)
		    pline("%s armor falls around %s!",
				 s_suffix(Monnam(mon)), pronoun);
		else
		    You_hear("a thud.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMC)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s %s falls, unsupported!",
				     s_suffix(Monnam(mon)), cloak_simple_name(otmp));
		    else
			pline("%s shrinks out of %s %s!", Monnam(mon),
						ppronoun, cloak_simple_name(otmp));
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMU)) != 0) {
		if (vis) {
		    if (sliparm(mon->data))
			pline("%s seeps right through %s shirt!",
					Monnam(mon), ppronoun);
		    else
			pline("%s becomes much too small for %s shirt!",
					Monnam(mon), ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny) {
	    /* [caller needs to handle weapon checks] */
	    if ((otmp = which_armor(mon, W_ARMG)) != 0) {
		if (vis)
		    pline("%s drops %s gloves%s!", Monnam(mon), ppronoun,
					MON_WEP(mon) ? " and weapon" : "");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	    if ((otmp = which_armor(mon, W_ARMS)) != 0) {
		if (vis)
		    pline("%s can no longer hold %s shield!", Monnam(mon),
								ppronoun);
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || has_horns(mdat)) {
	    if ((otmp = which_armor(mon, W_ARMH)) != 0 &&
		    /* flimsy test for horns matches polyself handling */
		    (handless_or_tiny || !is_flimsy(otmp))) {
		if (vis)
		    pline("%s helmet falls to the %s!",
			  s_suffix(Monnam(mon)), surface(mon->mx, mon->my));
		else
		    You_hear("a clank.");
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (handless_or_tiny || slithy(mdat) || mdat->mlet == S_CENTAUR) {
	    if ((otmp = which_armor(mon, W_ARMF)) != 0) {
		if (vis) {
		    if (is_whirly(mon->data))
			pline("%s boots fall away!",
				       s_suffix(Monnam(mon)));
		    else pline("%s boots %s off %s feet!",
			s_suffix(Monnam(mon)),
			verysmall(mdat) ? "slide" : "are pushed", ppronoun);
		}
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
	    }
	}
	if (!can_saddle(mon)) {
	    if ((otmp = which_armor(mon, W_SADDLE)) != 0) {
		if (polyspot) bypass_obj(otmp);
		m_lose_armor(mon, otmp);
		if (vis)
		    pline("%s saddle falls off.", s_suffix(Monnam(mon)));
	    }
	    if (mon == u.usteed)
		goto noride;
	} else if (mon == u.usteed && !can_ride(mon)) {
	noride:
	    pline("You can no longer ride %s.", mon_nam(mon));
	    if (touch_petrifies(u.usteed->data) &&
			!Stone_resistance && rnl(3)) {
		char buf[BUFSZ];

		pline("You touch %s.", mon_nam(u.usteed));
		sprintf(buf, "falling off %s",
				an(mons_mname(u.usteed->data)));
		delayed_petrify(NULL, buf);
	    }
	    dismount_steed(DISMOUNT_FELL);
	}
	return;
}